

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O2

qpTestResult __thiscall deqp::ShaderIntegerMixRenderCase::test(ShaderIntegerMixRenderCase *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  int i_1;
  int iVar5;
  deUint32 err;
  GLenum GVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  TestError *pTVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  int iVar14;
  GLSLVersion version;
  int iVar15;
  int i;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  IVec4 *pIVar19;
  int i_3;
  int i_2;
  uint uVar20;
  long lVar21;
  GLuint tex;
  GLuint fbo;
  allocator<char> local_4f5c;
  allocator<char> local_4f5b;
  allocator<char> local_4f5a;
  allocator<char> local_4f59;
  int local_4f58;
  int local_4f54;
  ulong local_4f50;
  long local_4f48;
  TestLog *local_4f40;
  string local_4f38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string local_4ee8;
  string local_4ec8;
  string local_4ea8;
  string fs_code;
  string vs_code;
  ShaderProgram prog;
  VertexArrayBinding vertexArrays [4];
  deInt32 a [1024];
  deInt32 b [1024];
  float vertex [512];
  deUint32 pointIndices [256];
  deInt32 sel [1024];
  IVec4 expected [256];
  
  log = ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar5 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  bVar4 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  version = (this->super_ShaderIntegerMixCase).m_glslVersion;
  if (!bVar4 || (int)version < 2 && bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_shader_integer_mix");
    if (!bVar4) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    version = (this->super_ShaderIntegerMixCase).m_glslVersion;
  }
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)a,"VERSION_DECL",(allocator<char> *)b);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)a);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)a,"EXTENSION_ENABLE",(allocator<char> *)b);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)a);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)a);
  std::__cxx11::string::string<std::allocator<char>>((string *)a,"TYPE",(allocator<char> *)b);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)a);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nin vec2 vertex;\nin ivec4 vs_in_a;\nin ivec4 vs_in_b;\nin ivec4 vs_in_sel;\n\nflat out ivec4 fs_in_a;\nflat out ivec4 fs_in_b;\nflat out ivec4 fs_in_sel;\nflat out ivec4 fs_in_result;\n\nvoid main()\n{\n    fs_in_a = vs_in_a;\n    fs_in_b = vs_in_b;\n    fs_in_sel = vs_in_sel;\n\n    ${TYPE} a = ${TYPE}(vs_in_a);\n    ${TYPE} b = ${TYPE}(vs_in_b);\n    bvec4 sel = bvec4(vs_in_sel);\n    fs_in_result = ivec4(mix(a, b, sel));\n\n    gl_Position = vec4(vertex, 0, 1);\n    gl_PointSize = 4.;\n}\n"
             ,(allocator<char> *)sel);
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&vs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  std::__cxx11::string::~string((string *)b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nout ivec4 o;\n\nflat in ivec4 fs_in_a;\nflat in ivec4 fs_in_b;\nflat in ivec4 fs_in_sel;\nflat in ivec4 fs_in_result;\n\nuniform bool use_vs_data;\n\nvoid main()\n{\n    if (use_vs_data)\n        o = fs_in_result;\n    else {\n        ${TYPE} a = ${TYPE}(fs_in_a);\n        ${TYPE} b = ${TYPE}(fs_in_b);\n        bvec4 sel = bvec4(fs_in_sel);\n        o = ivec4(mix(a, b, sel));\n    }\n}\n"
             ,(allocator<char> *)sel);
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&fs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  std::__cxx11::string::~string((string *)b);
  renderCtx = ((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)b,vs_code._M_dataplus._M_p,(allocator<char> *)expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sel,fs_code._M_dataplus._M_p,(allocator<char> *)vertex);
  glu::makeVtxFragSources((ProgramSources *)a,(string *)b,(string *)sel);
  glu::ShaderProgram::ShaderProgram(&prog,renderCtx,(ProgramSources *)a);
  glu::ProgramSources::~ProgramSources((ProgramSources *)a);
  std::__cxx11::string::~string((string *)sel);
  std::__cxx11::string::~string((string *)b);
  if (prog.m_program.m_info.linkOk != false) {
    bVar4 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
    if (!bVar4) {
      glwEnable(0x8642);
    }
    glwGenTextures(1,&tex);
    glwBindTexture(0xde1,tex);
    glwTexImage2D(0xde1,0,0x8d82,0x40,0x40,0,0x8d99,0x1404,(void *)0x0);
    glwBindTexture(0xde1,0);
    glwGenFramebuffers(1,&fbo);
    glwBindFramebuffer(0x8ca9,fbo);
    glwBindFramebuffer(0x8ca8,fbo);
    glwFramebufferTexture2D(0x8ca9,0x8ce0,0xde1,tex,0);
    err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
    glu::checkError(err,"Creation of rendering FBO failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
                    ,0x184);
    GVar6 = glwCheckFramebufferStatus(0x8ca9);
    if (GVar6 == 0x8cd5) {
      glwViewport(0,0,0x40,0x40);
      lVar21 = 0;
      local_4f48 = CONCAT44(extraout_var,iVar5);
      do {
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)((long)expected[0].m_data + lVar21));
        lVar3 = local_4f48;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x1000);
      iVar5 = 0;
      local_4f50 = 0;
      local_4f54 = 0;
      iVar15 = 0;
      local_4f58 = 0;
      iVar11 = 0;
      iVar18 = 0;
      uVar17 = 0;
      for (lVar21 = 0; lVar21 != 0x800; lVar21 = lVar21 + 8) {
        uVar16 = (uint)uVar17;
        uVar1 = (uint)(uVar17 >> 1);
        *(uint *)((long)b + lVar21 * 2) = iVar11 - 1U;
        iVar5 = iVar5 + -1;
        *(uint *)((long)sel + lVar21 * 2) = uVar16 & 1;
        *(int *)((long)b + lVar21 * 2 + 4) = iVar15 + -1;
        uVar20 = iVar11 - 1U;
        if ((uVar17 & 1) == 0) {
          uVar20 = uVar16;
        }
        *(uint *)((long)sel + lVar21 * 2 + 4) = uVar1 & 1;
        iVar14 = (int)local_4f50 + -1;
        iVar12 = iVar15 + -1;
        if ((uVar17 >> 1 & 1) == 0) {
          iVar12 = local_4f54;
        }
        *(int *)((long)b + lVar21 * 2 + 8) = iVar14;
        if ((uVar17 >> 2 & 1) == 0) {
          iVar14 = local_4f58;
        }
        *(uint *)((long)sel + lVar21 * 2 + 8) = (uint)(uVar17 >> 2) & 1;
        *(uint *)((long)sel + lVar21 * 2 + 0xc) = (uint)(uVar17 >> 3) & 1;
        *(uint *)((long)expected[0].m_data + lVar21 * 2) = uVar20;
        *(int *)((long)expected[0].m_data + lVar21 * 2 + 4) = iVar12;
        iVar12 = iVar5;
        if ((uVar17 >> 3 & 1) == 0) {
          iVar12 = iVar18;
        }
        *(int *)((long)expected[0].m_data + lVar21 * 2 + 8) = iVar14;
        *(int *)((long)expected[0].m_data + lVar21 * 2 + 0xc) = iVar12;
        pointIndices[uVar17] = uVar16;
        *(ulong *)((long)vertex + lVar21) =
             CONCAT44((float)((uint)lVar21 & 0x78 | 4) * 0.015625 + -1.0,
                      (float)(uVar1 & 0x78 | 4) * 0.015625 + -1.0);
        *(uint *)((long)a + lVar21 * 2) = uVar16;
        *(int *)((long)a + lVar21 * 2 + 4) = local_4f54;
        *(int *)((long)a + lVar21 * 2 + 8) = local_4f58;
        *(int *)((long)a + lVar21 * 2 + 0xc) = iVar18;
        *(int *)((long)b + lVar21 * 2 + 0xc) = iVar5;
        uVar17 = uVar17 + 1;
        iVar18 = iVar18 + 0xb;
        iVar11 = iVar11 + -0xb;
        local_4f58 = local_4f58 + 7;
        iVar15 = iVar15 + -7;
        local_4f54 = local_4f54 + 5;
        local_4f50 = (ulong)((int)local_4f50 - 5);
      }
      pIVar19 = expected;
      if (*this->type == 'b') {
        for (uVar17 = 0; uVar17 != 0x400; uVar17 = uVar17 + 1) {
          a[uVar17] = a[uVar17] & 1;
          b[uVar17] = b[uVar17] & 1;
          uVar10 = uVar17 >> 2 & 0x3fffffff;
          uVar2 = *(ulong *)(expected[uVar10].m_data + 2);
          *(ulong *)expected[uVar10].m_data = *(ulong *)expected[uVar10].m_data & 0x100000001;
          *(ulong *)(expected[uVar10].m_data + 2) = uVar2 & 0x100000001;
        }
      }
      local_4f40 = log;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f38,"vertex",&local_4f59)
      ;
      glu::va::Float(vertexArrays,&local_4f38,2,0x100,0,vertex);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4ea8,"vs_in_a",&local_4f5a);
      glu::va::Int32(vertexArrays + 1,&local_4ea8,4,0x100,0,a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4ec8,"vs_in_b",&local_4f5b);
      glu::va::Int32(vertexArrays + 2,&local_4ec8,4,0x100,0,b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4ee8,"vs_in_sel",&local_4f5c);
      glu::va::Int32(vertexArrays + 3,&local_4ee8,4,0x100,0,sel);
      std::__cxx11::string::~string((string *)&local_4ee8);
      std::__cxx11::string::~string((string *)&local_4ec8);
      std::__cxx11::string::~string((string *)&local_4ea8);
      std::__cxx11::string::~string((string *)&local_4f38);
      uVar7 = (**(code **)(lVar3 + 0xb48))(prog.m_program.m_program);
      (**(code **)(lVar3 + 0x1680))(prog.m_program.m_program);
      glwClearBufferiv(0x1800,0,test::clear);
      (**(code **)(lVar3 + 0x14f0))(uVar7,0);
      local_4f50 = CONCAT44(local_4f50._4_4_,uVar7);
      local_4f38._M_dataplus._M_p = (pointer)0x10000000006;
      local_4f38._M_string_length._0_4_ = 2;
      local_4f38.field_2._M_allocated_capacity = (size_type)pointIndices;
      glu::draw(((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,vertexArrays,(PrimitiveList *)&local_4f38,
                (DrawUtilCallback *)0x0);
      bVar13 = 1;
      for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 1) {
        bVar4 = probe_pixel(this,log,"Fragment",(int)((vertex[lVar21 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar21 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar19);
        bVar13 = bVar13 & bVar4;
        pIVar19 = pIVar19 + 1;
      }
      (**(code **)(local_4f48 + 0x14f0))(local_4f50 & 0xffffffff,1);
      local_4f38._M_dataplus._M_p = (pointer)0x10000000006;
      local_4f38._M_string_length._0_4_ = 2;
      local_4f38.field_2._M_allocated_capacity = (size_type)pointIndices;
      glu::draw(((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,vertexArrays,(PrimitiveList *)&local_4f38,
                (DrawUtilCallback *)0x0);
      pIVar19 = expected;
      for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 1) {
        bVar4 = probe_pixel(this,log,"Vertex",(int)((vertex[lVar21 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar21 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar19);
        bVar13 = bVar13 & bVar4;
        pIVar19 = pIVar19 + 1;
      }
      glwDeleteFramebuffers(1,&fbo);
      glwDeleteTextures(1,&tex);
      lVar21 = 0xf8;
      do {
        std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar21));
        lVar21 = lVar21 + -0x50;
      } while (lVar21 != -0x48);
      glu::ShaderProgram::~ShaderProgram(&prog);
      std::__cxx11::string::~string((string *)&fs_code);
      std::__cxx11::string::~string((string *)&vs_code);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&args._M_t);
      return (uint)(bVar13 ^ 1);
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Framebuffer not complete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
               ,0x187);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::operator<<(log,&prog);
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
             ,0x16e);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual qpTestResult test()
	{
		static const char vs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "in vec2 vertex;\n"
										  "in ivec4 vs_in_a;\n"
										  "in ivec4 vs_in_b;\n"
										  "in ivec4 vs_in_sel;\n"
										  "\n"
										  "flat out ivec4 fs_in_a;\n"
										  "flat out ivec4 fs_in_b;\n"
										  "flat out ivec4 fs_in_sel;\n"
										  "flat out ivec4 fs_in_result;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    fs_in_a = vs_in_a;\n"
										  "    fs_in_b = vs_in_b;\n"
										  "    fs_in_sel = vs_in_sel;\n"
										  "\n"
										  "    ${TYPE} a = ${TYPE}(vs_in_a);\n"
										  "    ${TYPE} b = ${TYPE}(vs_in_b);\n"
										  "    bvec4 sel = bvec4(vs_in_sel);\n"
										  "    fs_in_result = ivec4(mix(a, b, sel));\n"
										  "\n"
										  "    gl_Position = vec4(vertex, 0, 1);\n"
										  "    gl_PointSize = 4.;\n"
										  "}\n";

		static const char fs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "out ivec4 o;\n"
										  "\n"
										  "flat in ivec4 fs_in_a;\n"
										  "flat in ivec4 fs_in_b;\n"
										  "flat in ivec4 fs_in_sel;\n"
										  "flat in ivec4 fs_in_result;\n"
										  "\n"
										  "uniform bool use_vs_data;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    if (use_vs_data)\n"
										  "        o = fs_in_result;\n"
										  "    else {\n"
										  "        ${TYPE} a = ${TYPE}(fs_in_a);\n"
										  "        ${TYPE} b = ${TYPE}(fs_in_b);\n"
										  "        bvec4 sel = bvec4(fs_in_sel);\n"
										  "        o = ivec4(mix(a, b, sel));\n"
										  "    }\n"
										  "}\n";

		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;
		const char*			  extension_enable;
		bool				  is_es = glslVersionIsES(m_glslVersion);

		if ((is_es && (m_glslVersion < glu::GLSL_VERSION_310_ES)) || !is_es)
		{
			/* For versions that do not support this feature in Core it must be exposed via an extension. */
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			{
				return QP_TEST_RESULT_NOT_SUPPORTED;
			}

			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";
		}
		else
		{
			extension_enable = "";
		}

		/* Generate the specialization of the shader for the specific
		 * type being tested.
		 */
		std::map<std::string, std::string> args;

		args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(m_glslVersion);
		args["EXTENSION_ENABLE"] = extension_enable;
		args["TYPE"]			 = type;

		std::string vs_code = tcu::StringTemplate(vs_template).specialize(args);

		std::string fs_code = tcu::StringTemplate(fs_template).specialize(args);

		glu::ShaderProgram prog(m_context.getRenderContext(),
								glu::makeVtxFragSources(vs_code.c_str(), fs_code.c_str()));

		if (!prog.isOk())
		{
			log << prog;
			TCU_FAIL("Compile failed");
		}

		if (!glslVersionIsES(m_glslVersion))
			glEnable(GL_PROGRAM_POINT_SIZE);

		/* Generate an integer FBO for rendering.
		 */
		GLuint fbo;
		GLuint tex;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA32I, width, height, 0 /* border */, GL_RGBA_INTEGER, GL_INT,
					 NULL /* data */);
		glBindTexture(GL_TEXTURE_2D, 0);

		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Creation of rendering FBO failed.");

		if (glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			TCU_FAIL("Framebuffer not complete.");

		glViewport(0, 0, width, height);

		/* Fill a VBO with some vertex data.
		 */
		deUint32   pointIndices[256];
		float	  vertex[DE_LENGTH_OF_ARRAY(pointIndices) * 2];
		deInt32	a[DE_LENGTH_OF_ARRAY(pointIndices) * 4];
		deInt32	b[DE_LENGTH_OF_ARRAY(a)];
		deInt32	sel[DE_LENGTH_OF_ARRAY(a)];
		tcu::IVec4 expected[DE_LENGTH_OF_ARRAY(pointIndices)];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			pointIndices[i] = deUint16(i);

			const int x = (i / 16) * (width / 16) + (4 / 2);
			const int y = (i % 16) * (height / 16) + (4 / 2);

			vertex[(i * 2) + 0] = float(x) * 2.0f / float(width) - 1.0f;
			vertex[(i * 2) + 1] = float(y) * 2.0f / float(height) - 1.0f;

			a[(i * 4) + 0] = i;
			a[(i * 4) + 1] = i * 5;
			a[(i * 4) + 2] = i * 7;
			a[(i * 4) + 3] = i * 11;

			b[(i * 4) + 0] = ~a[(i * 4) + 3];
			b[(i * 4) + 1] = ~a[(i * 4) + 2];
			b[(i * 4) + 2] = ~a[(i * 4) + 1];
			b[(i * 4) + 3] = ~a[(i * 4) + 0];

			sel[(i * 4) + 0] = (i >> 0) & 1;
			sel[(i * 4) + 1] = (i >> 1) & 1;
			sel[(i * 4) + 2] = (i >> 2) & 1;
			sel[(i * 4) + 3] = (i >> 3) & 1;

			expected[i] = tcu::IVec4(
				sel[(i * 4) + 0] ? b[(i * 4) + 0] : a[(i * 4) + 0], sel[(i * 4) + 1] ? b[(i * 4) + 1] : a[(i * 4) + 1],
				sel[(i * 4) + 2] ? b[(i * 4) + 2] : a[(i * 4) + 2], sel[(i * 4) + 3] ? b[(i * 4) + 3] : a[(i * 4) + 3]);
		}

		/* Mask off all but the least significant bit for boolean
		 * types.
		 */
		if (type[0] == 'b')
		{
			for (int i = 0; i < DE_LENGTH_OF_ARRAY(a); i++)
			{
				a[i] &= 1;
				b[i] &= 1;

				expected[i / 4][0] &= 1;
				expected[i / 4][1] &= 1;
				expected[i / 4][2] &= 1;
				expected[i / 4][3] &= 1;
			}
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("vertex", 2, DE_LENGTH_OF_ARRAY(pointIndices), 0, vertex),
			glu::va::Int32("vs_in_a", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, a),
			glu::va::Int32("vs_in_b", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, b),
			glu::va::Int32("vs_in_sel", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, sel)
		};

		/* Render and verify the results.  Rendering happens twice.
		 * The first time, use_vs_data is false, and the mix() result
		 * from the fragment shader is used.  The second time,
		 * use_vs_data is true, and the mix() result from the vertex
		 * shader is used.
		 */
		const GLint loc = gl.getUniformLocation(prog.getProgram(), "use_vs_data");
		gl.useProgram(prog.getProgram());

		static const GLint clear[] = { 1, 2, 3, 4 };
		glClearBufferiv(GL_COLOR, 0, clear);

		gl.uniform1i(loc, 0);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Fragment", x, y, expected[i]) && pass;
		}

		gl.uniform1i(loc, 1);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Vertex", x, y, expected[i]) && pass;
		}

		glDeleteFramebuffers(1, &fbo);
		glDeleteTextures(1, &tex);

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}